

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VBufPack(N_Vector x,sunindextype param_2,int myid)

{
  uint uVar1;
  int iVar2;
  void *__s;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  sunindextype size;
  timespec spec;
  size_t local_48;
  timespec local_40;
  
  uVar1 = N_VBufSize();
  if (uVar1 == 0) {
    __s = malloc(local_48);
    if (__s != (void *)0x0) {
      if (0 < param_2) {
        memset(__s,0,param_2 * 8);
      }
      N_VConst(0x3ff0000000000000,x);
      clock_gettime(1,&local_40);
      lVar5 = local_40.tv_sec - base_time_tv_sec;
      dVar7 = (double)local_40.tv_nsec;
      uVar1 = N_VBufPack(x,__s);
      sync_device(x);
      clock_gettime(1,&local_40);
      if (uVar1 != 0) {
        free(__s);
        printf(">>> FAILED test -- N_VBufPack returned %d, Proc %d \n",(ulong)uVar1,
               (ulong)(uint)myid);
        return 1;
      }
      lVar3 = local_40.tv_sec - base_time_tv_sec;
      if (0 < param_2) {
        lVar6 = 0;
        iVar4 = 0;
        do {
          iVar2 = SUNRCompare(*(undefined8 *)((long)__s + lVar6 * 8),0x3ff0000000000000);
          iVar4 = iVar4 + iVar2;
          lVar6 = lVar6 + 1;
        } while (param_2 != lVar6);
        if (iVar4 != 0) {
          free(__s);
          printf(">>> FAILED test -- N_VBufPack failed, Proc %d \n",(ulong)(uint)myid);
          return 1;
        }
      }
      if (myid == 0) {
        puts("PASSED test -- N_VBufPack");
      }
      max_time(x,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar3) -
                 (dVar7 / 1000000000.0 + (double)lVar5));
      if (print_time != 0) {
        printf("%s Time: %22.15e\n\n","N_VBufPack");
      }
      free(__s);
      return 0;
    }
    printf(">>> FAILED test -- malloc failed, Proc %d \n",(ulong)(uint)myid);
  }
  else {
    printf(">>> FAILED test -- N_VBufSize returned %d, Proc %d \n",(ulong)uVar1,(ulong)(uint)myid);
  }
  return 1;
}

Assistant:

int Test_N_VBufPack(N_Vector x, sunindextype local_length, int myid)
{
  int flag = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i, size;
  sunrealtype* buf;

  /* get buffer size */
  flag = N_VBufSize(x, &size);
  if (flag != 0)
  {
    printf(">>> FAILED test -- N_VBufSize returned %d, Proc %d \n", flag, myid);
    return (1);
  }

  /* create and initialize buffer */
  buf = NULL;
  buf = (sunrealtype*)malloc((size_t)size);
  if (buf == NULL)
  {
    printf(">>> FAILED test -- malloc failed, Proc %d \n", myid);
    return (1);
  }

  for (i = 0; i < local_length; i++) { buf[i] = ZERO; }

  /* set vector data */
  N_VConst(ONE, x);

  /* fill buffer */
  start_time = get_time();
  flag       = N_VBufPack(x, (void*)buf);
  sync_device(x);
  stop_time = get_time();

  if (flag != 0)
  {
    free(buf);
    printf(">>> FAILED test -- N_VBufPack returned %d, Proc %d \n", flag, myid);
    return (1);
  }

  /* check buffer values */
  for (i = 0; i < local_length; i++) { failure += SUNRCompare(buf[i], ONE); }

  if (failure)
  {
    free(buf);
    printf(">>> FAILED test -- N_VBufPack failed, Proc %d \n", myid);
    return (1);
  }
  else if (myid == 0) { printf("PASSED test -- N_VBufPack\n"); }

  /* find max time across all processes */
  maxt = max_time(x, stop_time - start_time);
  PRINT_TIME("N_VBufPack", maxt);

  /* free buffer */
  free(buf);

  return (0);
}